

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v7::print<char[6],char_const(&)[1],unsigned_int&,char>
               (FILE *f,char (*format_str) [6],char (*args) [1],uint *args_1)

{
  char (*f_00) [6];
  remove_reference_t<unsigned_int_&> *in_R8;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_98;
  string_view local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_char[1],_unsigned_int>
  local_78;
  FILE *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_char[1],_unsigned_int>
  *vargs;
  uint *args_local_1;
  char (*args_local) [1];
  char (*format_str_local) [6];
  FILE *f_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  FILE *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  FILE *local_10;
  
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_char[1],_unsigned_int>
           *)args_1;
  args_local_1 = (uint *)args;
  args_local = (char (*) [1])format_str;
  format_str_local = (char (*) [6])f;
  make_args_checked<char_const(&)[1],unsigned_int&,char[6],char>
            (&local_78,(v7 *)format_str,(char (*) [6])args,
             (remove_reference_t<const_char_(&)[1]> *)args_1,in_R8);
  f_00 = format_str_local;
  local_58 = (FILE *)&local_78;
  local_88 = to_string_view<char,_0>(*args_local);
  local_28 = &local_98;
  f_local = local_58;
  local_20 = local_58;
  local_10 = local_58;
  local_18 = local_28;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_28,0x2c,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_58);
  vprint((FILE *)f_00,local_88,(format_args)local_98);
  return;
}

Assistant:

inline void print(std::FILE* f, const S& format_str, Args&&... args) {
  const auto& vargs = fmt::make_args_checked<Args...>(format_str, args...);
  return detail::is_unicode<Char>()
             ? vprint(f, to_string_view(format_str), vargs)
             : detail::vprint_mojibake(f, to_string_view(format_str), vargs);
}